

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

void sig_handler(int sig_nr)

{
  pid_t __pgrp;
  int __sig;
  
  if (sig_nr == 2) {
    sigaction(2,(sigaction *)&sigint_old_action,(sigaction *)0x0);
    __sig = 9;
  }
  else {
    if (sig_nr != 0xf) {
      if (sig_nr != 0xe) {
        eprintf("Unhandled signal: %d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/libs/check/src/check_run.c"
                ,0x8e,sig_nr);
      }
      alarm_received = 1;
      sig_nr = 9;
      __pgrp = group_pid;
      goto LAB_0015668b;
    }
    __sig = 0xf;
    sigaction(0xf,(sigaction *)&sigterm_old_action,(sigaction *)0x0);
  }
  killpg(group_pid,__sig);
  __pgrp = getpgrp();
LAB_0015668b:
  killpg(__pgrp,sig_nr);
  return;
}

Assistant:

static void CK_ATTRIBUTE_UNUSED sig_handler(int sig_nr)
{
    switch (sig_nr)
    {
        case SIGALRM:
            alarm_received = 1;
            killpg(group_pid, SIGKILL);
            break;
        case SIGTERM:
        case SIGINT:
        {
            pid_t own_group_pid;
            int child_sig = SIGTERM;

            if (sig_nr == SIGINT)
            {
                child_sig = SIGKILL;
                sigaction(SIGINT, &sigint_old_action, NULL);
            }
            else
            {
                sigaction(SIGTERM, &sigterm_old_action, NULL);
            }

            killpg(group_pid, child_sig);

            /* POSIX says that calling killpg(0)
             * does not necessarily mean to call it on the callers
             * group pid! */
            own_group_pid = getpgrp();
            killpg(own_group_pid, sig_nr);
            break;
        }
        default:
            eprintf("Unhandled signal: %d", __FILE__, __LINE__, sig_nr);
            break;
    }
}